

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AttachmentPromiseNode<kj::_::Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:359:25)>_>
::destroy(AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_coroutine_test_c__:359:25)>_>
          *this)

{
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:359:25)>
  ::~Deferred(&this->attachment);
  AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase(&this->super_AttachmentPromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }